

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O0

real __thiscall fasttext::QMatrix::dotRow(QMatrix *this,Vector *vec,int64_t i)

{
  pointer pfVar1;
  size_type in_RDX;
  uint8_t *in_RSI;
  Vector *in_RDI;
  real rVar2;
  ProductQuantizer *unaff_retaddr;
  real norm;
  undefined8 in_stack_ffffffffffffffc0;
  ProductQuantizer *in_stack_ffffffffffffffc8;
  Vector *x;
  
  if ((long)in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                  ,0x40,"real fasttext::QMatrix::dotRow(const Vector &, int64_t) const");
  }
  if ((long)in_RDX <
      (long)in_RDI[3].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
    x = in_RDI;
    pfVar1 = (pointer)Vector::size((Vector *)0x19b751);
    if (pfVar1 == in_RDI[3].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      if (((ulong)in_RDI[2].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) != 0) {
        std::
        unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
        operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                    *)0x19b7a4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &in_RDI[1].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,in_RDX);
        ProductQuantizer::get_centroids
                  (in_stack_ffffffffffffffc8,(int32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                   (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x18));
      }
      std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
      ::operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                    *)0x19b7df);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19b7fc);
      rVar2 = ProductQuantizer::mulcode
                        (unaff_retaddr,x,in_RSI,(int32_t)(in_RDX >> 0x20),(real)in_RDX);
      return rVar2;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                  ,0x42,"real fasttext::QMatrix::dotRow(const Vector &, int64_t) const");
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/qmatrix.cc"
                ,0x41,"real fasttext::QMatrix::dotRow(const Vector &, int64_t) const");
}

Assistant:

real QMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real norm = 1;
  if (qnorm_) {
    norm = npq_->get_centroids(0, norm_codes_[i])[0];
  }
  return pq_->mulcode(vec, codes_.data(), i, norm);
}